

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChProximityContainerSPH.cpp
# Opt level: O2

void __thiscall chrono::ChProximityContainerSPH::EndAddProximities(ChProximityContainerSPH *this)

{
  const_iterator __position;
  
  __position._M_node = (this->lastproximity)._M_node;
  while (__position._M_node != (_List_node_base *)&this->proximitylist) {
    if (__position._M_node[1]._M_next != (_List_node_base *)0x0) {
      (*(code *)(__position._M_node[1]._M_next)->_M_next->_M_prev)();
      __position._M_node = (this->lastproximity)._M_node;
    }
    __position._M_node =
         (_List_node_base *)
         std::__cxx11::list<chrono::ChProximitySPH_*,_std::allocator<chrono::ChProximitySPH_*>_>::
         erase(&this->proximitylist,__position);
    (this->lastproximity)._M_node = __position._M_node;
  }
  return;
}

Assistant:

void ChProximityContainerSPH::EndAddProximities() {
    // remove proximities that are beyond last proximity
    while (lastproximity != proximitylist.end()) {
        delete (*lastproximity);
        lastproximity = proximitylist.erase(lastproximity);
    }
}